

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  BumpAllocator *alloc;
  AssignmentPatternExpressionSyntax *pAVar1;
  BumpAllocator *in_stack_ffffffffffffffd8;
  BumpAllocator *args;
  BumpAllocator *pBVar2;
  
  pBVar2 = (BumpAllocator *)__child_stack;
  if (*(long *)(__fn + 0x18) == 0) {
    alloc = (BumpAllocator *)0x0;
  }
  else {
    alloc = (BumpAllocator *)
            deepClone<slang::syntax::DataTypeSyntax>
                      ((DataTypeSyntax *)__child_stack,in_stack_ffffffffffffffd8);
  }
  args = alloc;
  not_null<slang::syntax::AssignmentPatternSyntax_*>::operator*
            ((not_null<slang::syntax::AssignmentPatternSyntax_*> *)0xa2ce9c);
  deepClone<slang::syntax::AssignmentPatternSyntax>((AssignmentPatternSyntax *)__child_stack,alloc);
  pAVar1 = BumpAllocator::
           emplace<slang::syntax::AssignmentPatternExpressionSyntax,slang::syntax::DataTypeSyntax*,slang::syntax::AssignmentPatternSyntax&>
                     (pBVar2,(DataTypeSyntax **)args,(AssignmentPatternSyntax *)__child_stack);
  return (int)pAVar1;
}

Assistant:

static SyntaxNode* clone(const AssignmentPatternExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<AssignmentPatternExpressionSyntax>(
        node.type ? deepClone(*node.type, alloc) : nullptr,
        *deepClone<AssignmentPatternSyntax>(*node.pattern, alloc)
    );
}